

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

uint IncrWS(uint start,uint end,uint indent,int ixWS)

{
  uint local_28;
  uint local_24;
  uint st;
  int ixWS_local;
  uint indent_local;
  uint end_local;
  uint start_local;
  
  indent_local = start;
  if (0 < ixWS) {
    local_24 = indent;
    if ((uint)ixWS < indent) {
      local_24 = ixWS;
    }
    local_28 = end;
    if (start + local_24 < end) {
      local_28 = start + local_24;
    }
    indent_local = local_28;
  }
  return indent_local;
}

Assistant:

static uint IncrWS( uint start, uint end, uint indent, int ixWS )
{
  if ( ixWS > 0 )
  {
    uint st = start + MIN( (uint)ixWS, indent );
    start = MIN( st, end );
  }
  return start;
}